

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void readtechniques(uint32 numtechniques,uint8 *base,uint8 **ptr,uint32 *len,
                   MOJOSHADER_effectTechnique **techniques,MOJOSHADER_effectObject *objects,
                   MOJOSHADER_malloc m,void *d)

{
  uint32 offset;
  uint32 numannos_00;
  uint32 numpasses_00;
  MOJOSHADER_effectTechnique *pMVar1;
  char *pcVar2;
  uint32 numpasses;
  uint32 numannos;
  uint32 nameoffset;
  MOJOSHADER_effectTechnique *technique;
  uint32 siz;
  int i;
  MOJOSHADER_effectObject *objects_local;
  MOJOSHADER_effectTechnique **techniques_local;
  uint32 *len_local;
  uint8 **ptr_local;
  uint8 *base_local;
  uint32 numtechniques_local;
  
  if (numtechniques != 0) {
    pMVar1 = (MOJOSHADER_effectTechnique *)(*m)(numtechniques * 0x28,d);
    *techniques = pMVar1;
    memset(*techniques,0,(ulong)(numtechniques * 0x28));
    for (technique._4_4_ = 0; technique._4_4_ < numtechniques; technique._4_4_ = technique._4_4_ + 1
        ) {
      pMVar1 = *techniques + (int)technique._4_4_;
      offset = readui32(ptr,len);
      numannos_00 = readui32(ptr,len);
      numpasses_00 = readui32(ptr,len);
      pcVar2 = readstring(base,offset,m,d);
      pMVar1->name = pcVar2;
      pMVar1->annotation_count = numannos_00;
      readannotations(numannos_00,base,ptr,len,&pMVar1->annotations,objects,m,d);
      pMVar1->pass_count = numpasses_00;
      readpasses(numpasses_00,base,ptr,len,&pMVar1->passes,objects,m,d);
    }
  }
  return;
}

Assistant:

static void readtechniques(const uint32 numtechniques,
                           const uint8 *base,
                           const uint8 **ptr,
                           uint32 *len,
                           MOJOSHADER_effectTechnique **techniques,
                           MOJOSHADER_effectObject *objects,
                           MOJOSHADER_malloc m,
                           void *d)
{
    int i;
    if (numtechniques == 0) return;

    const uint32 siz = sizeof (MOJOSHADER_effectTechnique) * numtechniques;
    *techniques = (MOJOSHADER_effectTechnique *) m(siz, d);
    memset(*techniques, '\0', siz);

    for (i = 0; i < numtechniques; i++)
    {
        MOJOSHADER_effectTechnique *technique = &(*techniques)[i];

        const uint32 nameoffset = readui32(ptr, len);
        const uint32 numannos = readui32(ptr, len);
        const uint32 numpasses = readui32(ptr, len);

        technique->name = readstring(base, nameoffset, m, d);

        technique->annotation_count = numannos;
        readannotations(numannos, base, ptr, len,
                        &technique->annotations, objects,
                        m, d);

        technique->pass_count = numpasses;
        readpasses(numpasses, base, ptr, len,
                   &technique->passes, objects,
                   m, d);
    } // for
}